

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qprocess.cpp
# Opt level: O1

void QProcess::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  Channel *pCVar2;
  bool bVar3;
  offset_in_QProcess_to_subr *candidate;
  undefined4 uVar4;
  int iVar5;
  QProcessPrivate *this;
  long in_FS_OFFSET;
  undefined4 local_40;
  undefined4 local_3c;
  void *local_38;
  undefined4 *puStack_30;
  undefined4 *local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    plVar1 = (long *)_a[1];
    if (((((code *)*plVar1 == started) && (uVar4 = 0, plVar1[1] == 0)) ||
        (((code *)*plVar1 == finished && (uVar4 = 1, plVar1[1] == 0)))) ||
       (((((code *)*plVar1 == errorOccurred && (uVar4 = 3, plVar1[1] == 0)) ||
         (((code *)*plVar1 == stateChanged && (uVar4 = 4, plVar1[1] == 0)))) ||
        ((((code *)*plVar1 == readyReadStandardOutput && (uVar4 = 5, plVar1[1] == 0)) ||
         (((code *)*plVar1 == readyReadStandardError && (uVar4 = 6, plVar1[1] == 0)))))))) {
      *(undefined4 *)*_a = uVar4;
    }
    goto LAB_0042c276;
  }
  if (_c != InvokeMetaMethod) goto LAB_0042c276;
  switch(_id) {
  case 0:
    iVar5 = 0;
    break;
  case 1:
    local_3c = *_a[1];
    local_40 = *_a[2];
    goto LAB_0042c11c;
  case 2:
    local_3c = *_a[1];
    local_40 = 0;
LAB_0042c11c:
    local_28 = &local_40;
    iVar5 = 1;
    break;
  case 3:
    local_3c = *_a[1];
    iVar5 = 3;
    break;
  case 4:
    local_3c = *_a[1];
    local_28 = &local_40;
    iVar5 = 4;
    break;
  case 5:
    iVar5 = 5;
    break;
  case 6:
    iVar5 = 6;
    break;
  case 7:
    QProcessPrivate::terminateProcess((QProcessPrivate *)(_o->d_ptr).d);
    goto LAB_0042c276;
  case 8:
    QProcessPrivate::killProcess((QProcessPrivate *)(_o->d_ptr).d);
    goto LAB_0042c276;
  case 9:
    this = (QProcessPrivate *)(_o->d_ptr).d;
    pCVar2 = &this->stdinChannel;
    goto LAB_0042c1bd;
  case 10:
    this = (QProcessPrivate *)(_o->d_ptr).d;
    pCVar2 = &this->stdoutChannel;
LAB_0042c1bd:
    bVar3 = QProcessPrivate::tryReadFromChannel(this,pCVar2 + 1);
    goto LAB_0042c1c2;
  case 0xb:
    bVar3 = QProcessPrivate::_q_canWrite((QProcessPrivate *)(_o->d_ptr).d);
    goto LAB_0042c1c2;
  case 0xc:
    bVar3 = QProcessPrivate::_q_startupNotification((QProcessPrivate *)(_o->d_ptr).d);
LAB_0042c1c2:
    if (*_a != (void *)0x0) {
      *(bool *)*_a = bVar3;
    }
    goto LAB_0042c276;
  case 0xd:
    QProcessPrivate::_q_processDied((QProcessPrivate *)(_o->d_ptr).d);
  default:
    goto LAB_0042c276;
  }
  puStack_30 = &local_3c;
  local_38 = (void *)0x0;
  QMetaObject::activate(_o,&staticMetaObject,iVar5,&local_38);
LAB_0042c276:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProcess::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QProcess *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->started(QPrivateSignal()); break;
        case 1: _t->finished((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QProcess::ExitStatus>>(_a[2]))); break;
        case 2: _t->finished((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->errorOccurred((*reinterpret_cast< std::add_pointer_t<QProcess::ProcessError>>(_a[1]))); break;
        case 4: _t->stateChanged((*reinterpret_cast< std::add_pointer_t<QProcess::ProcessState>>(_a[1])), QPrivateSignal()); break;
        case 5: _t->readyReadStandardOutput(QPrivateSignal()); break;
        case 6: _t->readyReadStandardError(QPrivateSignal()); break;
        case 7: _t->terminate(); break;
        case 8: _t->kill(); break;
        case 9: { bool _r = _t->d_func()->_q_canReadStandardOutput();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 10: { bool _r = _t->d_func()->_q_canReadStandardError();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 11: { bool _r = _t->d_func()->_q_canWrite();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 12: { bool _r = _t->d_func()->_q_startupNotification();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 13: _t->d_func()->_q_processDied(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QProcess::*)(QPrivateSignal)>(_a, &QProcess::started, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QProcess::*)(int , QProcess::ExitStatus )>(_a, &QProcess::finished, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QProcess::*)(QProcess::ProcessError )>(_a, &QProcess::errorOccurred, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QProcess::*)(QProcess::ProcessState , QPrivateSignal)>(_a, &QProcess::stateChanged, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QProcess::*)(QPrivateSignal)>(_a, &QProcess::readyReadStandardOutput, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QProcess::*)(QPrivateSignal)>(_a, &QProcess::readyReadStandardError, 6))
            return;
    }
}